

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeCurves(ProjectWriter *this)

{
  Curve *this_00;
  bool bVar1;
  int iVar2;
  _Setw _Var3;
  vector<Curve_*,_std::allocator<Curve_*>_> *this_01;
  reference ppCVar4;
  ostream *poVar5;
  double dVar6;
  int local_38;
  int i;
  Curve *curve;
  iterator __end1;
  iterator __begin1;
  vector<Curve_*,_std::allocator<Curve_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[CURVES]\n");
  this_01 = &this->network->curves;
  __end1 = std::vector<Curve_*,_std::allocator<Curve_*>_>::begin(this_01);
  curve = (Curve *)std::vector<Curve_*,_std::allocator<Curve_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Curve_**,_std::vector<Curve_*,_std::allocator<Curve_*>_>_>
                                *)&curve);
    if (!bVar1) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<Curve_**,_std::vector<Curve_*,_std::allocator<Curve_*>_>_>::
              operator*(&__end1);
    this_00 = *ppCVar4;
    iVar2 = Curve::curveType(this_00);
    if (iVar2 != 0) {
      poVar5 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::left);
      _Var3 = std::setw(0x10);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = std::operator<<(poVar5,(string *)&(this_00->super_Element).name);
      poVar5 = std::operator<<(poVar5,"  ");
      iVar2 = Curve::curveType(this_00);
      poVar5 = std::operator<<(poVar5,Curve::CurveTypeWords[iVar2]);
      std::operator<<(poVar5,"\n");
    }
    local_38 = 0;
    while( true ) {
      iVar2 = Curve::size(this_00);
      if (iVar2 <= local_38) break;
      _Var3 = std::setw(0x10);
      poVar5 = std::operator<<((ostream *)&this->field_0x18,_Var3);
      poVar5 = std::operator<<(poVar5,(string *)&(this_00->super_Element).name);
      std::operator<<(poVar5,"  ");
      _Var3 = std::setw(0xc);
      poVar5 = std::operator<<((ostream *)&this->field_0x18,_Var3);
      dVar6 = Curve::x(this_00,local_38);
      std::ostream::operator<<(poVar5,dVar6);
      _Var3 = std::setw(0xc);
      poVar5 = std::operator<<((ostream *)&this->field_0x18,_Var3);
      dVar6 = Curve::y(this_00,local_38);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar6);
      std::operator<<(poVar5,"\n");
      local_38 = local_38 + 1;
    }
    __gnu_cxx::__normal_iterator<Curve_**,_std::vector<Curve_*,_std::allocator<Curve_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeCurves()
{
    fout << "\n[CURVES]\n";
    for (Curve* curve : network->curves)
    {
        if (curve->curveType() != Curve::UNKNOWN)
        {
            fout << left << setw(16) << curve->name << "  " <<
                Curve::CurveTypeWords[curve->curveType()] << "\n";
        }
        for (int i = 0; i < curve->size(); i++)
        {
            fout << setw(16) << curve->name << "  ";
            fout << setw(12) << curve->x(i);
            fout << setw(12) << curve->y(i) << "\n";
        }
    }
}